

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  bool bVar10;
  uint uVar11;
  undefined4 extraout_EAX;
  int iVar12;
  int iVar13;
  uint flag;
  long lVar14;
  long lVar15;
  secp256k1_scalar *b_00;
  byte bVar16;
  long lVar17;
  secp256k1_gej *r_00;
  secp256k1_fe *a;
  secp256k1_ge *r_01;
  uint uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  unsigned_long _zzq_result;
  secp256k1_ge r;
  unsigned_long _zzq_args [6];
  secp256k1_scalar n;
  uchar b [32];
  secp256k1_gej rp;
  undefined1 auStack_340 [16];
  undefined1 auStack_330 [16];
  undefined1 auStack_320 [16];
  undefined1 auStack_310 [16];
  secp256k1_fe *psStack_300;
  secp256k1_fe *psStack_2f8;
  secp256k1_fe sStack_2f0;
  undefined1 auStack_2c0 [32];
  undefined1 auStack_2a0 [16];
  secp256k1_fe sStack_290;
  undefined1 auStack_250 [16];
  undefined1 auStack_240 [16];
  undefined4 uStack_230;
  undefined1 auStack_220 [40];
  secp256k1_scalar *psStack_1f8;
  secp256k1_scalar *psStack_1f0;
  int *piStack_1e8;
  secp256k1_scalar *psStack_1e0;
  ulong uStack_1d8;
  secp256k1_ge *psStack_1d0;
  undefined8 local_1c8;
  uint local_1bc;
  secp256k1_scalar *local_1b8;
  secp256k1_scalar *local_1b0;
  secp256k1_ge local_1a8;
  undefined8 local_138;
  secp256k1_ge *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  secp256k1_scalar local_108;
  undefined1 local_e8 [184];
  
  local_1bc = 0;
  psStack_1d0 = (secp256k1_ge *)0x14473e;
  local_1b8 = seckey;
  local_1b0 = message;
  secp256k1_ecmult_gen(ctx,(secp256k1_gej *)(local_e8 + 0x20),nonce);
  psStack_1d0 = (secp256k1_ge *)0x14474e;
  secp256k1_ge_set_gej(&local_1a8,(secp256k1_gej *)(local_e8 + 0x20));
  psStack_1d0 = (secp256k1_ge *)0x144756;
  secp256k1_fe_normalize(&local_1a8.x);
  psStack_1d0 = (secp256k1_ge *)0x144760;
  secp256k1_fe_normalize(&local_1a8.y);
  r_00 = (secp256k1_gej *)local_e8;
  psStack_1d0 = (secp256k1_ge *)0x144773;
  secp256k1_fe_get_b32((uchar *)r_00,&local_1a8.x);
  psStack_1d0 = (secp256k1_ge *)0x144783;
  secp256k1_scalar_set_b32(sigr,(uchar *)r_00,(int *)&local_1bc);
  uVar11 = local_1bc;
  if (recid != (int *)0x0) {
    uVar19 = (ulong)local_1bc;
    a = &local_1a8.y;
    psStack_1d0 = (secp256k1_ge *)0x144797;
    secp256k1_fe_verify(a);
    if (local_1a8.y.normalized == 0) {
      psStack_1d0 = (secp256k1_ge *)secp256k1_ecmult_gen;
      secp256k1_ecdsa_sig_sign_cold_1();
      piStack_1e8 = recid;
      auStack_240 = (undefined1  [16])0x0;
      auStack_250 = (undefined1  [16])0x0;
      uStack_230 = 0;
      auStack_340 = (undefined1  [16])0x0;
      auStack_330 = (undefined1  [16])0x0;
      auStack_320 = (undefined1  [16])0x0;
      auStack_310 = (undefined1  [16])0x0;
      psStack_1f8 = sigs;
      psStack_1f0 = nonce;
      psStack_1e0 = sigr;
      uStack_1d8 = uVar19;
      psStack_1d0 = &local_1a8;
      secp256k1_scalar_add((secp256k1_scalar *)auStack_220,(secp256k1_scalar *)(a->n + 1),b_00);
      bVar16 = 0;
      uVar19 = 0;
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_220);
        *(int *)(auStack_250 + uVar19 * 4) =
             (int)(*(ulong *)(auStack_220 + (uVar19 >> 1 & 0x7fffffff) * 8) >> (bVar16 & 0x20));
        uVar19 = uVar19 + 1;
        bVar16 = bVar16 + 0x20;
      } while (uVar19 != 8);
      auStack_220._16_16_ = (undefined1  [16])0x0;
      auStack_220._0_16_ = (undefined1  [16])0x0;
      auStack_2c0._8_8_ = (secp256k1_scalar *)auStack_220;
      auStack_2c0._0_8_ = 0x4d430001;
      auStack_2c0._16_16_ = ZEXT816(0x20);
      auStack_2a0 = ZEXT816(0);
      lVar17 = 0x288ed0;
      psStack_300 = a + 3;
      bVar10 = true;
      lVar15 = 0;
      iVar12 = 0;
      psStack_2f8 = a;
      do {
        iVar13 = 0;
        uVar11 = 0;
        r_01 = (secp256k1_ge *)auStack_2c0;
        do {
          bVar5 = (byte)(iVar12 + iVar13) & 0x1f;
          bVar16 = (byte)iVar13 & 0x1f;
          uVar11 = (*(uint *)(auStack_250 + (ulong)((uint)(iVar12 + iVar13) >> 5) * 4) >> bVar5 |
                   *(uint *)(auStack_250 + (ulong)((uint)(iVar12 + iVar13) >> 5) * 4) <<
                   0x20 - bVar5) << ((byte)iVar13 & 0x1f) ^
                   uVar11 & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
          iVar13 = iVar13 + 1;
        } while (iVar13 != 6);
        flag = uVar11 >> 5 & 1;
        uVar19 = 0;
        do {
          uVar18 = (uint)(((-flag ^ uVar11) & 0x1f) << 6 == uVar19);
          uVar3 = (ulong)((long)r_01 << 3) >> 0x33;
          uVar4 = (((long)r_01 << 3 | (ulong)r_01 >> 0x3d) << 0xd | uVar3) >> 3;
          uVar2 = uVar4 << 0x33;
          lVar1 = (long)(int)uVar18 + -1;
          lVar14 = -(long)(int)uVar18;
          auVar20._8_4_ = (int)lVar1;
          auVar20._0_8_ = lVar1;
          auVar20._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar23._8_4_ = (int)lVar14;
          auVar23._0_8_ = lVar14;
          auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auStack_340 = *(undefined1 (*) [16])(lVar17 + -0x30 + uVar19) & auVar23 |
                        auStack_340 & auVar20;
          auStack_330 = auVar23 & *(undefined1 (*) [16])(lVar17 + -0x20 + uVar19) |
                        auVar20 & auStack_330;
          uVar3 = (uVar2 | (uVar3 << 0x3d | uVar4) >> 0xd) << 3;
          uVar4 = uVar3 >> 0x33;
          uVar2 = ((uVar3 | uVar2 >> 0x3d) << 0xd | uVar4) >> 3;
          r_01 = (secp256k1_ge *)(uVar2 << 0x33 | (uVar4 << 0x3d | uVar2) >> 0xd);
          lVar1 = (long)(int)uVar18 + -1;
          lVar14 = -(long)(int)uVar18;
          auVar21._8_4_ = (int)lVar1;
          auVar21._0_8_ = lVar1;
          auVar21._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar24._8_4_ = (int)lVar14;
          auVar24._0_8_ = lVar14;
          auVar24._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auStack_320 = *(undefined1 (*) [16])(lVar17 + -0x10 + uVar19) & auVar24 |
                        auStack_320 & auVar21;
          auStack_310 = auVar24 & *(undefined1 (*) [16])(lVar17 + uVar19) | auVar21 & auStack_310;
          uVar19 = uVar19 + 0x40;
        } while (uVar19 != 0x800);
        secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)auStack_340);
        secp256k1_fe_verify(&sStack_290);
        secp256k1_fe_verify_magnitude(&sStack_290,1);
        sStack_2f0.n[1] = 0x3ffffffffffffc - sStack_290.n[1];
        sStack_2f0.n[0] = 0x3ffffbfffff0bc - sStack_290.n[0];
        sStack_2f0.n[3] = 0x3ffffffffffffc - sStack_290.n[3];
        sStack_2f0.n[2] = 0x3ffffffffffffc - sStack_290.n[2];
        sStack_2f0._40_8_ = 2;
        sStack_2f0.n[4] = 0x3fffffffffffc - sStack_290.n[4];
        secp256k1_fe_verify(&sStack_2f0);
        secp256k1_fe_cmov(&sStack_290,&sStack_2f0,flag);
        if (bVar10) {
          secp256k1_gej_set_ge(r_00,(secp256k1_ge *)auStack_2c0);
          secp256k1_gej_rescale(r_00,psStack_300);
          bVar10 = false;
        }
        else {
          secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)auStack_2c0);
        }
        iVar12 = iVar12 + 6;
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x800;
      } while (lVar15 != 0x2b);
      secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)&psStack_2f8->magnitude);
      return 0;
    }
    *recid = ((uint)local_1a8.y.n[0] & 1) + uVar11 * 2;
  }
  psStack_1d0 = (secp256k1_ge *)0x1447c9;
  secp256k1_scalar_mul(&local_108,sigr,local_1b8);
  psStack_1d0 = (secp256k1_ge *)0x1447d9;
  secp256k1_scalar_add(&local_108,&local_108,local_1b0);
  psStack_1d0 = (secp256k1_ge *)0x1447e4;
  secp256k1_scalar_inverse(sigs,nonce);
  psStack_1d0 = (secp256k1_ge *)0x1447f2;
  secp256k1_scalar_mul(sigs,sigs,&local_108);
  local_108.d[2] = 0;
  local_108.d[3] = 0;
  local_108.d[0] = 0;
  local_108.d[1] = 0;
  local_138 = 0x4d430001;
  local_128 = 0x20;
  local_120 = 0;
  local_118 = 0;
  local_110 = 0;
  local_1c8 = 0;
  psStack_1d0 = (secp256k1_ge *)0x14485f;
  local_130 = (secp256k1_ge *)&local_108;
  memset(local_e8 + 0x20,0,0x98);
  local_1a8.x.n[0] = 0;
  local_1a8.x.n[1] = 0;
  local_1a8.x.n[2] = 0;
  local_1a8.x.n[3] = 0;
  local_1a8.x.n[4] = 0;
  local_1a8.x.magnitude = 0;
  local_1a8.x.normalized = 0;
  local_1a8.y.n[0] = 0;
  local_1a8.y.n[1] = 0;
  local_1a8.y.n[2] = 0;
  local_1a8.y.n[3] = 0;
  local_1a8.y.n[4] = 0;
  local_1a8.y.magnitude = 0;
  local_1a8.y.normalized = 0;
  local_1a8.infinity = 0;
  local_1a8._100_4_ = 0;
  local_130 = &local_1a8;
  local_138 = 0x4d430001;
  local_128 = 0x68;
  local_120 = 0;
  local_118 = 0;
  local_110 = 0;
  local_1c8 = 0;
  psStack_1d0 = (secp256k1_ge *)0x144912;
  uVar11 = secp256k1_scalar_is_high(sigs);
  psStack_1d0 = (secp256k1_ge *)0x14491e;
  secp256k1_scalar_cond_negate(sigs,uVar11);
  if (recid != (int *)0x0) {
    *recid = *recid ^ uVar11;
  }
  psStack_1d0 = (secp256k1_ge *)0x14492f;
  secp256k1_scalar_verify(sigr);
  uVar6 = sigr->d[0];
  uVar7 = sigr->d[1];
  uVar8 = sigr->d[2];
  uVar9 = sigr->d[3];
  psStack_1d0 = (secp256k1_ge *)0x14495b;
  secp256k1_scalar_verify(sigs);
  auVar22._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0);
  auVar22._4_4_ = -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0);
  auVar22._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0);
  auVar22._12_4_ =
       -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0);
  iVar12 = movmskps(extraout_EAX,auVar22);
  return (int)(iVar12 != 0xf && ((uVar9 != 0 || uVar7 != 0) || (uVar8 != 0 || uVar6 != 0)));
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}